

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::iostreams::detail::file_descriptor_impl>::
reset<boost::iostreams::detail::file_descriptor_impl>
          (shared_ptr<boost::iostreams::detail::file_descriptor_impl> *this,file_descriptor_impl *p)

{
  bool bVar1;
  shared_ptr<boost::iostreams::detail::file_descriptor_impl> local_28;
  file_descriptor_impl *local_18;
  file_descriptor_impl *p_local;
  shared_ptr<boost::iostreams::detail::file_descriptor_impl> *this_local;
  
  bVar1 = true;
  if (p != (file_descriptor_impl *)0x0) {
    bVar1 = p != this->px;
  }
  local_18 = p;
  p_local = (file_descriptor_impl *)this;
  if (!bVar1) {
    __assert_fail("p == 0 || p != px",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/smart_ptr/shared_ptr.hpp"
                  ,0x298,
                  "void boost::shared_ptr<boost::iostreams::detail::file_descriptor_impl>::reset(Y *) [T = boost::iostreams::detail::file_descriptor_impl, Y = boost::iostreams::detail::file_descriptor_impl]"
                 );
  }
  shared_ptr<boost::iostreams::detail::file_descriptor_impl>(&local_28,p);
  swap(&local_28,this);
  ~shared_ptr(&local_28);
  return;
}

Assistant:

void reset( Y * p ) // Y must be complete
    {
        BOOST_ASSERT( p == 0 || p != px ); // catch self-reset errors
        this_type( p ).swap( *this );
    }